

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_extension.cpp
# Opt level: O1

unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>
duckdb::ParquetScanReplacement
          (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_> context,
          ClientContext *input,undefined8 *param_3)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *plVar2;
  _Head_base<0UL,_duckdb::TableFunctionRef_*,_false> _Var3;
  _Alloc_hider _Var4;
  bool bVar5;
  char cVar6;
  TableFunctionRef *this;
  ConstantExpression *pCVar7;
  pointer pTVar8;
  pointer *__ptr;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  templated_unique_single_t table_function;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  children;
  string table_name;
  _Head_base<0UL,_duckdb::TableFunctionRef_*,_false> local_118;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_110;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  local_108;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0 [2];
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_70 [2];
  
  ReplacementScan::GetFullPath
            (&local_f0,(string *)*param_3,(string *)param_3[1],(string *)param_3[2]);
  paVar1 = &local_d0[0].field_2;
  local_d0[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"parquet","");
  __l._M_len = 1;
  __l._M_array = local_d0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(local_70,__l,(allocator_type *)&local_108);
  bVar5 = ReplacementScan::CanReplace
                    (&local_f0,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      *)local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0[0]._M_dataplus._M_p);
  }
  if (bVar5) {
    this = (TableFunctionRef *)operator_new(0x78);
    duckdb::TableFunctionRef::TableFunctionRef(this);
    local_108.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_108.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_108.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_118._M_head_impl = this;
    local_90[0] = local_80;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_90,local_f0._M_dataplus._M_p,
               local_f0._M_dataplus._M_p + local_f0._M_string_length);
    duckdb::Value::Value((Value *)local_70,local_90);
    pCVar7 = (ConstantExpression *)operator_new(0x78);
    duckdb::Value::Value((Value *)local_d0,(Value *)local_70);
    duckdb::ConstantExpression::ConstantExpression(pCVar7,local_d0);
    duckdb::Value::~Value((Value *)local_d0);
    local_110._M_head_impl = (ParsedExpression *)pCVar7;
    std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)&local_108,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&local_110);
    if (local_110._M_head_impl != (ParsedExpression *)0x0) {
      (**(code **)(*(long *)local_110._M_head_impl + 8))();
    }
    local_110._M_head_impl = (ParsedExpression *)0x0;
    duckdb::Value::~Value((Value *)local_70);
    if (local_90[0] != local_80) {
      operator_delete(local_90[0]);
    }
    make_uniq<duckdb::FunctionExpression,char_const(&)[13],duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
              ((duckdb *)local_d0,(char (*) [13])"parquet_scan",
               (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                *)&local_108);
    _Var4._M_p = local_d0[0]._M_dataplus._M_p;
    local_d0[0]._M_dataplus._M_p = (pointer)0x0;
    pTVar8 = unique_ptr<duckdb::TableFunctionRef,_std::default_delete<duckdb::TableFunctionRef>,_true>
             ::operator->((unique_ptr<duckdb::TableFunctionRef,_std::default_delete<duckdb::TableFunctionRef>,_true>
                           *)&local_118);
    plVar2 = *(long **)(pTVar8 + 0x68);
    *(pointer *)(pTVar8 + 0x68) = _Var4._M_p;
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 8))();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0[0]._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_d0[0]._M_dataplus._M_p + 8))();
    }
    cVar6 = duckdb::FileSystem::HasGlob((string *)&local_f0);
    if (cVar6 == '\0') {
      duckdb::FileSystem::GetFileSystem(input);
      duckdb::FileSystem::ExtractBaseName((string *)local_d0);
      pTVar8 = unique_ptr<duckdb::TableFunctionRef,_std::default_delete<duckdb::TableFunctionRef>,_true>
               ::operator->((unique_ptr<duckdb::TableFunctionRef,_std::default_delete<duckdb::TableFunctionRef>,_true>
                             *)&local_118);
      std::__cxx11::string::operator=((string *)(pTVar8 + 0x10),(string *)local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_d0[0]._M_dataplus._M_p);
      }
    }
    _Var3._M_head_impl = local_118._M_head_impl;
    local_118._M_head_impl = (TableFunctionRef *)0x0;
    *(TableFunctionRef **)
     context._M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>.
     _M_t.super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
     super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl = _Var3._M_head_impl;
    std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ::~vector(&local_108);
    if (local_118._M_head_impl != (TableFunctionRef *)0x0) {
      (**(code **)(*(long *)local_118._M_head_impl + 8))();
    }
  }
  else {
    *(undefined8 *)
     context._M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>.
     _M_t.super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
     super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl = 0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  return (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)
         (__uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)
         context._M_t.
         super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
         super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<TableRef> ParquetScanReplacement(ClientContext &context, ReplacementScanInput &input,
                                            optional_ptr<ReplacementScanData> data) {
	auto table_name = ReplacementScan::GetFullPath(input);
	if (!ReplacementScan::CanReplace(table_name, {"parquet"})) {
		return nullptr;
	}
	auto table_function = make_uniq<TableFunctionRef>();
	vector<unique_ptr<ParsedExpression>> children;
	children.push_back(make_uniq<ConstantExpression>(Value(table_name)));
	table_function->function = make_uniq<FunctionExpression>("parquet_scan", std::move(children));

	if (!FileSystem::HasGlob(table_name)) {
		auto &fs = FileSystem::GetFileSystem(context);
		table_function->alias = fs.ExtractBaseName(table_name);
	}

	return std::move(table_function);
}